

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O3

bool __thiscall
MultiSigningProvider::GetPubKey(MultiSigningProvider *this,CKeyID *keyid,CPubKey *pubkey)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  char cVar4;
  undefined8 *puVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = *(undefined8 **)&this->m_providers;
  puVar3 = *(undefined8 **)&this->field_0x10;
  if (puVar2 == puVar3) {
    cVar4 = '\0';
  }
  else {
    do {
      puVar5 = puVar2 + 1;
      cVar4 = (**(code **)(*(long *)*puVar2 + 0x20))((long *)*puVar2,keyid,pubkey);
      if (cVar4 != '\0') break;
      puVar2 = puVar5;
    } while (puVar5 != puVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)cVar4;
}

Assistant:

bool MultiSigningProvider::GetPubKey(const CKeyID& keyid, CPubKey& pubkey) const
{
    for (const auto& provider: m_providers) {
        if (provider->GetPubKey(keyid, pubkey)) return true;
    }
    return false;
}